

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCaseFilters::shouldInclude(TestCaseFilters *this,TestCase *testCase)

{
  bool bVar1;
  TestCase *in_RSI;
  TestCaseFilter *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  const_iterator itEnd_2;
  const_iterator it_2;
  const_iterator itEnd_1;
  const_iterator it_1;
  TestCase *in_stack_ffffffffffffffa8;
  __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
  in_stack_ffffffffffffffc0;
  TagExpression *in_stack_ffffffffffffffc8;
  __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
  local_30;
  TagExpression *local_28;
  __normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
  local_20;
  TestCase *local_18;
  
  local_18 = in_RSI;
  bVar1 = std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::empty
                    ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)
                     in_stack_ffffffffffffffc0._M_current);
  if (!bVar1) {
    local_20._M_current =
         (TagExpression *)
         std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::begin
                   ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)
                    in_stack_ffffffffffffffa8);
    local_28 = (TagExpression *)
               std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::end
                         ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)
                          in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      in_stack_ffffffffffffffa8 =
           (TestCase *)
           __gnu_cxx::
           __normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
           ::operator->(&local_20);
      TestCase::getTags_abi_cxx11_(local_18);
      bVar1 = TagExpression::matches
                        (in_stack_ffffffffffffffc8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffffc0._M_current);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
      ::operator++(&local_20);
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::TagExpression_*,_std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      return false;
    }
  }
  bVar1 = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::empty
                    ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
                     in_stack_ffffffffffffffc0._M_current);
  if (bVar1) {
    bVar1 = std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::empty
                      ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
                       in_stack_ffffffffffffffc0._M_current);
    if ((bVar1) &&
       (bVar1 = std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::empty
                          ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)
                           in_stack_ffffffffffffffc0._M_current), bVar1)) {
      bVar1 = TestCase::isHidden(local_18);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    local_30._M_current =
         (TestCaseFilter *)
         std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::begin
                   ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
                    in_stack_ffffffffffffffa8);
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::end
              ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
               in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
      ::operator->(&local_30);
      bVar1 = TestCaseFilter::shouldInclude(in_RDI,in_stack_ffffffffffffffa8);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
      ::operator++(&local_30);
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      return false;
    }
  }
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::begin
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_ffffffffffffffa8);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::end
            ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
             in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
    ::operator->((__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                  *)&stack0xffffffffffffffc0);
    bVar1 = TestCaseFilter::shouldInclude(in_RDI,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
    ::operator++((__normal_iterator<const_Catch::TestCaseFilter_*,_std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  return false;
}

Assistant:

bool shouldInclude( TestCase const& testCase ) const {
            if( !m_tagExpressions.empty() ) {
                std::vector<TagExpression>::const_iterator it = m_tagExpressions.begin();
                std::vector<TagExpression>::const_iterator itEnd = m_tagExpressions.end();
                for(; it != itEnd; ++it )
                    if( it->matches( testCase.getTags() ) )
                        break;
                if( it == itEnd )
                    return false;
            }

            if( !m_inclusionFilters.empty() ) {
                std::vector<TestCaseFilter>::const_iterator it = m_inclusionFilters.begin();
                std::vector<TestCaseFilter>::const_iterator itEnd = m_inclusionFilters.end();
                for(; it != itEnd; ++it )
                    if( it->shouldInclude( testCase ) )
                        break;
                if( it == itEnd )
                    return false;
            }
            else if( m_exclusionFilters.empty() && m_tagExpressions.empty() ) {
                return !testCase.isHidden();
            }

            std::vector<TestCaseFilter>::const_iterator it = m_exclusionFilters.begin();
            std::vector<TestCaseFilter>::const_iterator itEnd = m_exclusionFilters.end();
            for(; it != itEnd; ++it )
                if( !it->shouldInclude( testCase ) )
                    return false;
            return true;
        }